

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlXPathNodeSetRemove(void)

{
  int iVar1;
  int iVar2;
  xmlNodeSetPtr val_00;
  int local_24;
  int n_val;
  int val;
  int n_cur;
  xmlNodeSetPtr cur;
  int mem_base;
  int test_ret;
  
  cur._4_4_ = 0;
  for (n_val = 0; n_val < 1; n_val = n_val + 1) {
    for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
      iVar1 = xmlMemBlocks();
      val_00 = gen_xmlNodeSetPtr(n_val,0);
      iVar2 = gen_int(local_24,1);
      xmlXPathNodeSetRemove(val_00,iVar2);
      call_tests = call_tests + 1;
      des_xmlNodeSetPtr(n_val,val_00,0);
      des_int(local_24,iVar2,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathNodeSetRemove",(ulong)(uint)(iVar2 - iVar1));
        cur._4_4_ = cur._4_4_ + 1;
        printf(" %d",(ulong)(uint)n_val);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return cur._4_4_;
}

Assistant:

static int
test_xmlXPathNodeSetRemove(void) {
    int test_ret = 0;

#if defined(LIBXML_XPATH_ENABLED)
    int mem_base;
    xmlNodeSetPtr cur; /* the initial node set */
    int n_cur;
    int val; /* the index to remove */
    int n_val;

    for (n_cur = 0;n_cur < gen_nb_xmlNodeSetPtr;n_cur++) {
    for (n_val = 0;n_val < gen_nb_int;n_val++) {
        mem_base = xmlMemBlocks();
        cur = gen_xmlNodeSetPtr(n_cur, 0);
        val = gen_int(n_val, 1);

        xmlXPathNodeSetRemove(cur, val);
        call_tests++;
        des_xmlNodeSetPtr(n_cur, cur, 0);
        des_int(n_val, val, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlXPathNodeSetRemove",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_cur);
            printf(" %d", n_val);
            printf("\n");
        }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}